

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_engraved_label.cxx
# Opt level: O2

void innards(Fl_Label *o,int X,int Y,int W,int H,Fl_Align align,int (*data) [3],int n)

{
  Fl_Color *pFVar1;
  Fl_Align align_00;
  ulong uVar2;
  ulong uVar3;
  Fl_Color *pFVar4;
  
  align_00 = align;
  if ((align & 0x40) != 0) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)W,(ulong)(uint)H);
    align_00 = align & 0xffffffbf;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)o->font,(ulong)(uint)o->size);
  uVar3 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar3;
  }
  pFVar4 = (Fl_Color *)(*data + 2);
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pFVar1 = &o->color;
    if ((long)uVar3 < (long)(n + -1)) {
      pFVar1 = pFVar4;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
              (fl_graphics_driver,(ulong)*pFVar1);
    fl_draw(o->value,pFVar4[-2] + X,pFVar4[-1] + Y,W,H,align_00,(Fl_Image *)0x0,1);
    pFVar4 = pFVar4 + 3;
  }
  if ((align & 0x40) == 0) {
    return;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

static void innards(
    const Fl_Label* o, int X, int Y, int W, int H, Fl_Align align,
    const int data[][3], int n)
{
  Fl_Align a1 = align;
  if (a1 & FL_ALIGN_CLIP) {
    fl_push_clip(X, Y, W, H); a1 = (Fl_Align)(a1&~FL_ALIGN_CLIP);}
  fl_font((Fl_Font)o->font, o->size);
  for (int i = 0; i < n; i++) {
    fl_color((Fl_Color)(i < n-1 ? data[i][2] : o->color));
    fl_draw(o->value, X+data[i][0], Y+data[i][1], W, H, a1);
  }
  if (align & FL_ALIGN_CLIP) fl_pop_clip();
}